

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void vkt::sr::anon_unknown_0::eval_rightShift_ivec2(ShaderEvalContext *c)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = (int)c->in[0].m_data[3];
  iVar3 = (int)c->in[0].m_data[1];
  bVar1 = (byte)(int)c->in[1].m_data[1];
  bVar2 = (byte)(int)c->in[1].m_data[0];
  (c->color).m_data[1] =
       (float)(int)(iVar4 >> 0x1f & ~(0xffffffffU >> (bVar1 & 0x1f)) | iVar4 >> (bVar1 & 0x1f));
  (c->color).m_data[2] =
       (float)(int)(iVar3 >> 0x1f & ~(0xffffffffU >> (bVar2 & 0x1f)) | iVar3 >> (bVar2 & 0x1f));
  return;
}

Assistant:

inline Vector<NewT, Size> Vector<T, Size>::cast (void) const
{
	Vector<NewT, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = NewT(m_data[i]);
	return res;
}